

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPSDESInfo::DeletePrivatePrefix(RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen)

{
  SDESPrivateItem *obj;
  int iVar1;
  reference ppSVar2;
  RTPMemoryManager *mgr;
  bool local_71;
  const_iterator local_60;
  _List_node_base *local_58;
  size_t l;
  uint8_t *p;
  _List_node_base *local_40;
  byte local_31;
  iterator iStack_30;
  bool found;
  iterator it;
  size_t prefixlen_local;
  uint8_t *prefix_local;
  RTCPSDESInfo *this_local;
  
  it._M_node = (_List_node_base *)prefixlen;
  std::_List_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_iterator
            (&stack0xffffffffffffffd0);
  local_31 = 0;
  local_40 = (_List_node_base *)
             std::__cxx11::
             list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
             ::begin(&this->privitems);
  iStack_30 = (iterator)local_40;
  while( true ) {
    local_71 = false;
    if ((local_31 & 1) == 0) {
      p = (uint8_t *)
          std::__cxx11::
          list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
          ::end(&this->privitems);
      local_71 = std::operator!=(&stack0xffffffffffffffd0,(_Self *)&p);
    }
    if (local_71 == false) break;
    ppSVar2 = std::_List_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&stack0xffffffffffffffd0);
    l = (size_t)SDESPrivateItem::GetPrefix(*ppSVar2,(size_t *)&local_58);
    if (local_58 == it._M_node) {
      if (local_58 == (_List_node_base *)0x0) {
        local_31 = 1;
      }
      else {
        iVar1 = memcmp(prefix,(void *)l,(size_t)local_58);
        if (iVar1 == 0) {
          local_31 = 1;
        }
        else {
          std::_List_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++
                    (&stack0xffffffffffffffd0);
        }
      }
    }
    else {
      std::_List_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++
                (&stack0xffffffffffffffd0);
    }
  }
  if ((local_31 & 1) == 0) {
    this_local._4_4_ = -0x39;
  }
  else {
    ppSVar2 = std::_List_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&stack0xffffffffffffffd0);
    obj = *ppSVar2;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTCPSDESInfo::SDESPrivateItem>(obj,mgr);
    std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
              (&local_60,&stack0xffffffffffffffd0);
    std::__cxx11::
    list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
    ::erase(&this->privitems,local_60);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPSDESInfo::DeletePrivatePrefix(const uint8_t *prefix,size_t prefixlen)
{
	std::list<SDESPrivateItem *>::iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (!found)
		return ERR_RTP_SDES_PREFIXNOTFOUND;
	
	RTPDelete(*it,GetMemoryManager());
	privitems.erase(it);
	return 0;
}